

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bernstein_polynomial.cpp
# Opt level: O1

double r8mat_is_identity(int n,double *a)

{
  ulong uVar1;
  ulong uVar2;
  double *pdVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  
  dVar5 = 0.0;
  if (0 < n) {
    uVar1 = (ulong)(uint)n;
    uVar2 = 0;
    do {
      uVar4 = 0;
      pdVar3 = a;
      do {
        if (uVar2 == uVar4) {
          dVar6 = *pdVar3 + -1.0;
        }
        else {
          dVar6 = *pdVar3;
        }
        dVar5 = dVar5 + dVar6 * dVar6;
        uVar4 = uVar4 + 1;
        pdVar3 = pdVar3 + uVar1;
      } while (uVar1 != uVar4);
      uVar2 = uVar2 + 1;
      a = a + 1;
    } while (uVar2 != uVar1);
  }
  if (0.0 <= dVar5) {
    return SQRT(dVar5);
  }
  dVar5 = sqrt(dVar5);
  return dVar5;
}

Assistant:

double r8mat_is_identity ( int n, double a[] )

//****************************************************************************80
//
//  Purpose:
//
//    R8MAT_IS_IDENTITY determines if an R8MAT is the identity.
//
//  Discussion:
//
//    An R8MAT is a matrix of real ( kind = 8 ) values.
//
//    The routine returns the Frobenius norm of A - I.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    29 July 2011
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order of the matrix.
//
//    Input, double A[N*N], the matrix.
//
//    Output, double R8MAT_IS_IDENTITY, the Frobenius norm
//    of the difference matrix A - I, which would be exactly zero
//    if A were the identity matrix.
//
{
  double error_frobenius;
  int i;
  int j;
  double t;

  error_frobenius = 0.0;

  for ( i = 0; i < n; i++ )
  {
    for ( j = 0; j < n; j++ )
    {
      if ( i == j )
      {
        t = a[i+j*n] - 1.0;
      }
      else
      {
        t = a[i+j*n];
      }
      error_frobenius = error_frobenius + t * t;
    }
  }
  error_frobenius = sqrt ( error_frobenius );

  return error_frobenius;
}